

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xpath_derived_from(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,
                      lys_module *param_4,lyxp_set *set,int options)

{
  byte bVar1;
  lyxp_set_type lVar2;
  hash_table *phVar3;
  int iVar4;
  lyxp_set *plVar5;
  lys_node *plVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  ushort uVar10;
  ly_ctx *plVar11;
  undefined8 uVar12;
  ushort uVar13;
  lyd_node *plVar14;
  ulong uVar15;
  int local_38;
  
  plVar5 = *args;
  lVar2 = plVar5->type;
  if ((options & 0x1cU) == 0) {
    if (LYXP_SET_NODE_SET < lVar2) {
      if (lVar2 < (LYXP_SET_NUMBER|LYXP_SET_SNODE_SET)) {
        uVar12 = *(undefined8 *)(&DAT_001ced58 + (ulong)lVar2 * 8);
      }
      else {
        uVar12 = 0;
      }
      ly_vlog(param_4->ctx,LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,uVar12,
              "derived-from(node-set, string)");
      return -1;
    }
    iVar4 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
    if (iVar4 != 0) {
      return -1;
    }
    set_free_content(set);
    set->type = LYXP_SET_BOOLEAN;
    (set->val).bool = 0;
    if ((*args)->type == LYXP_SET_EMPTY) {
      return 0;
    }
    plVar5 = *args;
    if (plVar5->used == 0) {
      return 0;
    }
    uVar13 = 0;
    do {
      plVar14 = (plVar5->val).nodes[uVar13].node;
      if (((plVar14->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
         (*(int *)&plVar14->schema[1].ref == 7)) {
        bVar1 = *(byte *)((long)&plVar14->child->next + 7);
        uVar10 = (ushort)bVar1;
        if (bVar1 == 0) {
          uVar10 = 0;
        }
        else {
          phVar3 = plVar14->child->ht;
          pcVar8 = (args[1]->val).str;
          uVar15 = 0;
          do {
            iVar4 = xpath_derived_from_ident_cmp(*(lys_ident **)(&phVar3->used + uVar15 * 2),pcVar8)
            ;
            if (iVar4 == 0) {
              set_free_content(set);
              set->type = LYXP_SET_BOOLEAN;
              (set->val).bool = 1;
              uVar10 = (ushort)uVar15;
              break;
            }
            uVar15 = uVar15 + 1;
          } while (bVar1 != uVar15);
        }
        if (uVar10 < *(byte *)((long)&plVar14->child->next + 7)) {
          return 0;
        }
      }
      uVar13 = uVar13 + 1;
      plVar5 = *args;
      if (plVar5->used <= (uint)uVar13) {
        return 0;
      }
    } while( true );
  }
  if (lVar2 == LYXP_SET_SNODE_SET) {
    uVar7 = plVar5->used;
    plVar14 = (lyd_node *)0x0;
    do {
      uVar7 = uVar7 - 1;
      if ((plVar5->val).nodes[uVar7].pos == 1) {
        plVar14 = (plVar5->val).nodes[uVar7].node;
        break;
      }
    } while (uVar7 != 0);
    if (plVar14 == (lyd_node *)0x0) goto LAB_00183174;
    if ((*(LYS_NODE *)&plVar14->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      plVar11 = param_4->ctx;
      plVar6 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar14->ht);
      pcVar8 = "Argument #1 of %s is a %s node \"%s\".";
LAB_001831fd:
      local_38 = 1;
      ly_log(plVar11,LY_LLWRN,LY_SUCCESS,pcVar8,"xpath_derived_from",plVar6);
    }
    else {
      iVar4 = warn_is_specific_type((lys_type *)&plVar14[1].ht,LY_TYPE_IDENT);
      local_38 = 0;
      if (iVar4 == 0) {
        plVar11 = param_4->ctx;
        plVar6 = plVar14->schema;
        pcVar8 = "Argument #1 of %s is node \"%s\", not of type \"identityref\".";
        goto LAB_001831fd;
      }
    }
  }
  else {
LAB_00183174:
    local_38 = 1;
    ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s not a node-set as expected.",
           "xpath_derived_from");
  }
  plVar5 = args[1];
  if (plVar5->type == LYXP_SET_SNODE_SET) {
    uVar7 = plVar5->used;
    plVar14 = (lyd_node *)0x0;
    do {
      uVar7 = uVar7 - 1;
      if ((plVar5->val).nodes[uVar7].pos == 1) {
        plVar14 = (plVar5->val).nodes[uVar7].node;
        break;
      }
    } while (uVar7 != 0);
    if (plVar14 != (lyd_node *)0x0) {
      if ((*(LYS_NODE *)&plVar14->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar11 = param_4->ctx;
        plVar6 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar14->ht);
        pcVar8 = "Argument #2 of %s is a %s node \"%s\".";
      }
      else {
        iVar4 = warn_is_string_type((lys_type *)&plVar14[1].ht);
        if (iVar4 != 0) goto LAB_001832b6;
        plVar11 = param_4->ctx;
        plVar6 = plVar14->schema;
        pcVar8 = "Argument #2 of %s is node \"%s\", not of string-type.";
      }
      local_38 = 1;
      ly_log(plVar11,LY_LLWRN,LY_SUCCESS,pcVar8,"xpath_derived_from",plVar6);
    }
  }
LAB_001832b6:
  uVar7 = set->used;
  if ((ulong)uVar7 != 0) {
    lVar9 = 0;
    do {
      if (*(int *)((long)&((set->val).nodes)->pos + lVar9) == 1) {
        *(undefined4 *)((long)&((set->val).nodes)->pos + lVar9) = 0;
      }
      lVar9 = lVar9 + 0x10;
    } while ((ulong)uVar7 << 4 != lVar9);
  }
  return local_38;
}

Assistant:

static int
xpath_derived_from(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
                   struct lyxp_set *set, int options)
{
    uint16_t i, j;
    struct lyd_node_leaf_list *leaf;
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type != LYXP_SET_SNODE_SET) || !(sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s not a node-set as expected.", __func__);
            ret = EXIT_FAILURE;
        } else if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
            ret = EXIT_FAILURE;
        } else if (!warn_is_specific_type(&sleaf->type, LY_TYPE_IDENT)) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of type \"identityref\".", __func__, sleaf->name);
            ret = EXIT_FAILURE;
        }

        if ((args[1]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if ((args[0]->type != LYXP_SET_NODE_SET) && (args[0]->type != LYXP_SET_EMPTY)) {
        LOGVAL(local_mod->ctx, LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "derived-from(node-set, string)");
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    set_fill_boolean(set, 0);
    if (args[0]->type != LYXP_SET_EMPTY) {
        for (i = 0; i < args[0]->used; ++i) {
            leaf = (struct lyd_node_leaf_list *)args[0]->val.nodes[i].node;
            sleaf = (struct lys_node_leaf *)leaf->schema;
            if ((sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && (sleaf->type.base == LY_TYPE_IDENT)) {
                for (j = 0; j < leaf->value.ident->base_size; ++j) {
                    if (!xpath_derived_from_ident_cmp(leaf->value.ident->base[j], args[1]->val.str)) {
                        set_fill_boolean(set, 1);
                        break;
                    }
                }

                if (j < leaf->value.ident->base_size) {
                    break;
                }
            }
        }
    }

    return EXIT_SUCCESS;
}